

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

aom_noise_status_t
aom_noise_model_update
          (aom_noise_model_t *noise_model,uint8_t **data,uint8_t **denoised,int w,int h,int *stride,
          int *chroma_sub_log2,uint8_t *flat_blocks,int block_size)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int in_ECX;
  double *in_RDX;
  uint8_t *unaff_RBX;
  uint8_t *unaff_RBP;
  undefined8 *in_RSI;
  double in_RDI;
  int in_R8D;
  double *in_R9;
  double unaff_R12;
  aom_noise_model_t *unaff_R13;
  undefined8 unaff_R15;
  bool bVar4;
  uint8_t *unaff_retaddr;
  aom_noise_state_t *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000014;
  uint in_stack_00000018;
  undefined4 in_stack_0000001c;
  uint8_t *in_stack_00000020;
  uint8_t *in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  undefined4 in_stack_0000003c;
  int in_stack_00000040;
  undefined4 in_stack_00000044;
  int in_stack_00000048;
  undefined4 in_stack_0000004c;
  int in_stack_00000050;
  uint8_t *in_stack_00000058;
  int in_stack_00000060;
  int in_stack_00000068;
  int is_chroma;
  int *sub;
  uint8_t *alt_denoised;
  uint8_t *alt_data;
  int no_subsampling [2];
  int channel;
  int i;
  int num_blocks;
  int y_model_different;
  int num_blocks_h;
  int num_blocks_w;
  undefined4 in_stack_fffffffffffffefc;
  aom_equation_system_t *in_stack_ffffffffffffff00;
  aom_noise_state_t *eqns;
  aom_noise_strength_solver_t *dest;
  int iVar5;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff44;
  aom_noise_state_t *state;
  aom_noise_model_t *noise_model_00;
  undefined1 local_80 [8];
  uint local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  double *local_60;
  int local_58;
  double *local_50;
  undefined8 *local_48;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  aom_noise_status_t aVar6;
  
  local_64 = (int)(in_ECX + in_stack_00000018 + -1) / (int)in_stack_00000018;
  local_68 = (int)(in_R8D + in_stack_00000018 + -1) / (int)in_stack_00000018;
  local_6c = 0;
  local_70 = 0;
  local_74 = 0;
  local_78 = 0;
  if ((int)in_stack_00000018 < 2) {
    fprintf(_stderr,"block_size = %d must be > 1\n",(ulong)in_stack_00000018);
    aVar6 = '\x01';
  }
  else if ((int)in_stack_00000018 < *(int *)((long)in_RDI + 4) * 2 + 1) {
    fprintf(_stderr,"block_size = %d must be >= %d\n",(ulong)in_stack_00000018,
            (ulong)(*(int *)((long)in_RDI + 4) * 2 + 1));
    aVar6 = '\x01';
  }
  else {
    local_60 = in_R9;
    local_58 = in_R8D;
    local_50 = in_RDX;
    local_48 = in_RSI;
    for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
      equation_system_clear(in_stack_ffffffffffffff00);
      *(undefined4 *)((long)in_RDI + (long)local_74 * 0x70 + 0x1c0) = 0;
      noise_strength_solver_clear((aom_noise_strength_solver_t *)0x3a6347);
    }
    for (local_74 = 0; local_74 < local_68 * local_64; local_74 = local_74 + 1) {
      if (*(char *)(CONCAT44(in_stack_00000014,in_stack_00000010) + (long)local_74) != '\0') {
        local_70 = local_70 + 1;
      }
    }
    if (local_70 < 2) {
      fprintf(_stderr,"Not enough flat blocks to update noise estimate\n");
      aVar6 = '\x02';
    }
    else {
      for (local_78 = 0; (int)local_78 < 3; local_78 = local_78 + 1) {
        memset(local_80,0,8);
        if ((int)local_78 < 1) {
          noise_model_00 = (aom_noise_model_t *)0x0;
          eqns = (aom_noise_state_t *)local_80;
        }
        else {
          noise_model_00 = (aom_noise_model_t *)*local_48;
          eqns = in_stack_00000008;
        }
        bVar4 = local_78 == 0;
        if ((local_48[(int)local_78] == 0) || (local_50[(int)local_78] == 0.0)) break;
        state = eqns;
        iVar1 = add_block_observations
                          (unaff_R13,(int)((ulong)unaff_R12 >> 0x20),unaff_RBX,
                           (uint8_t *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                           (int)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),in_stack_00000010,
                           (int *)CONCAT44(in_stack_0000001c,in_stack_00000018),in_stack_00000020,
                           in_stack_00000028,in_stack_00000030,
                           (uint8_t *)CONCAT44(in_stack_0000003c,in_stack_00000038),
                           in_stack_00000040,in_stack_00000048,in_stack_00000050);
        if (iVar1 == 0) {
          fprintf(_stderr,"Adding block observation failed\n");
          return '\x04';
        }
        iVar1 = ar_equation_system_solve(state,in_stack_ffffffffffffff44);
        if (iVar1 == 0) {
          if (bVar4) {
            fprintf(_stderr,"Solving latest noise equation system failed %d!\n",(ulong)local_78);
            return '\x04';
          }
          set_chroma_coefficient_fallback_soln(&eqns->eqns);
        }
        dest = (aom_noise_strength_solver_t *)
               CONCAT44((int)((ulong)eqns >> 0x20),
                        *(undefined4 *)((long)local_60 + (long)(int)local_78 * 4));
        iVar1 = local_58;
        iVar5 = local_68;
        add_noise_std_observations
                  ((aom_noise_model_t *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                   in_stack_00000014,(double *)in_stack_00000008,unaff_retaddr,unaff_RBP,
                   (int)((ulong)unaff_R15 >> 0x20),in_stack_00000030,in_stack_00000038,
                   (int *)CONCAT44(in_stack_00000044,in_stack_00000040),
                   (uint8_t *)CONCAT44(in_stack_0000004c,in_stack_00000048),in_stack_00000050,
                   in_stack_00000058,in_stack_00000060,in_stack_00000068,(int)sub);
        iVar2 = aom_noise_strength_solver_solve
                          ((aom_noise_strength_solver_t *)CONCAT44(in_stack_ffffffffffffff3c,iVar5))
        ;
        if (iVar2 == 0) {
          fprintf(_stderr,"Solving latest noise strength failed!\n");
          return '\x04';
        }
        if (((local_78 == 0) && (0 < *(int *)((long)in_RDI + 100))) &&
           (iVar2 = is_noise_model_different(noise_model_00), iVar2 != 0)) {
          local_6c = 1;
        }
        if (local_6c == 0) {
          lVar3 = (long)in_RDI + 0x10 + (long)(int)local_78 * 0x70;
          *(int *)(lVar3 + 0x60) =
               *(int *)((long)in_RDI + (long)(int)local_78 * 0x70 + 0x1c0) + *(int *)(lVar3 + 0x60);
          equation_system_add((aom_equation_system_t *)
                              ((long)in_RDI + 0x10 + (long)(int)local_78 * 0x70),
                              (aom_equation_system_t *)
                              ((long)in_RDI + 0x160 + (long)(int)local_78 * 0x70));
          iVar2 = ar_equation_system_solve(state,in_stack_ffffffffffffff44);
          if (iVar2 == 0) {
            if (bVar4) {
              fprintf(_stderr,"Solving combined noise equation system failed %d!\n",(ulong)local_78)
              ;
              return '\x04';
            }
            set_chroma_coefficient_fallback_soln(&dest->eqns);
          }
          noise_strength_solver_add
                    (dest,(aom_noise_strength_solver_t *)CONCAT44(in_stack_fffffffffffffefc,iVar1));
          iVar1 = aom_noise_strength_solver_solve
                            ((aom_noise_strength_solver_t *)
                             CONCAT44(in_stack_ffffffffffffff3c,iVar5));
          if (iVar1 == 0) {
            fprintf(_stderr,"Solving combined noise strength failed!\n");
            return '\x04';
          }
        }
      }
      aVar6 = '\0';
      if (local_6c != 0) {
        aVar6 = '\x03';
      }
    }
  }
  return aVar6;
}

Assistant:

aom_noise_status_t aom_noise_model_update(
    aom_noise_model_t *const noise_model, const uint8_t *const data[3],
    const uint8_t *const denoised[3], int w, int h, int stride[3],
    int chroma_sub_log2[2], const uint8_t *const flat_blocks, int block_size) {
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  int y_model_different = 0;
  int num_blocks = 0;
  int i = 0, channel = 0;

  if (block_size <= 1) {
    fprintf(stderr, "block_size = %d must be > 1\n", block_size);
    return AOM_NOISE_STATUS_INVALID_ARGUMENT;
  }

  if (block_size < noise_model->params.lag * 2 + 1) {
    fprintf(stderr, "block_size = %d must be >= %d\n", block_size,
            noise_model->params.lag * 2 + 1);
    return AOM_NOISE_STATUS_INVALID_ARGUMENT;
  }

  // Clear the latest equation system
  for (i = 0; i < 3; ++i) {
    equation_system_clear(&noise_model->latest_state[i].eqns);
    noise_model->latest_state[i].num_observations = 0;
    noise_strength_solver_clear(&noise_model->latest_state[i].strength_solver);
  }

  // Check that we have enough flat blocks
  for (i = 0; i < num_blocks_h * num_blocks_w; ++i) {
    if (flat_blocks[i]) {
      num_blocks++;
    }
  }

  if (num_blocks <= 1) {
    fprintf(stderr, "Not enough flat blocks to update noise estimate\n");
    return AOM_NOISE_STATUS_INSUFFICIENT_FLAT_BLOCKS;
  }

  for (channel = 0; channel < 3; ++channel) {
    int no_subsampling[2] = { 0, 0 };
    const uint8_t *alt_data = channel > 0 ? data[0] : 0;
    const uint8_t *alt_denoised = channel > 0 ? denoised[0] : 0;
    int *sub = channel > 0 ? chroma_sub_log2 : no_subsampling;
    const int is_chroma = channel != 0;
    if (!data[channel] || !denoised[channel]) break;
    if (!add_block_observations(noise_model, channel, data[channel],
                                denoised[channel], w, h, stride[channel], sub,
                                alt_data, alt_denoised, stride[0], flat_blocks,
                                block_size, num_blocks_w, num_blocks_h)) {
      fprintf(stderr, "Adding block observation failed\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }

    if (!ar_equation_system_solve(&noise_model->latest_state[channel],
                                  is_chroma)) {
      if (is_chroma) {
        set_chroma_coefficient_fallback_soln(
            &noise_model->latest_state[channel].eqns);
      } else {
        fprintf(stderr, "Solving latest noise equation system failed %d!\n",
                channel);
        return AOM_NOISE_STATUS_INTERNAL_ERROR;
      }
    }

    add_noise_std_observations(
        noise_model, channel, noise_model->latest_state[channel].eqns.x,
        data[channel], denoised[channel], w, h, stride[channel], sub, alt_data,
        stride[0], flat_blocks, block_size, num_blocks_w, num_blocks_h);

    if (!aom_noise_strength_solver_solve(
            &noise_model->latest_state[channel].strength_solver)) {
      fprintf(stderr, "Solving latest noise strength failed!\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }

    // Check noise characteristics and return if error.
    if (channel == 0 &&
        noise_model->combined_state[channel].strength_solver.num_equations >
            0 &&
        is_noise_model_different(noise_model)) {
      y_model_different = 1;
    }

    // Don't update the combined stats if the y model is different.
    if (y_model_different) continue;

    noise_model->combined_state[channel].num_observations +=
        noise_model->latest_state[channel].num_observations;
    equation_system_add(&noise_model->combined_state[channel].eqns,
                        &noise_model->latest_state[channel].eqns);
    if (!ar_equation_system_solve(&noise_model->combined_state[channel],
                                  is_chroma)) {
      if (is_chroma) {
        set_chroma_coefficient_fallback_soln(
            &noise_model->combined_state[channel].eqns);
      } else {
        fprintf(stderr, "Solving combined noise equation system failed %d!\n",
                channel);
        return AOM_NOISE_STATUS_INTERNAL_ERROR;
      }
    }

    noise_strength_solver_add(
        &noise_model->combined_state[channel].strength_solver,
        &noise_model->latest_state[channel].strength_solver);

    if (!aom_noise_strength_solver_solve(
            &noise_model->combined_state[channel].strength_solver)) {
      fprintf(stderr, "Solving combined noise strength failed!\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }
  }

  return y_model_different ? AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE
                           : AOM_NOISE_STATUS_OK;
}